

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::AttributeTranslator::seal(AttributeTranslator *this)

{
  _Head_base<0UL,_arangodb::velocypack::Builder_*,_false> _Var1;
  uint8_t *slice;
  uint64_t uVar2;
  int in_ESI;
  Slice key;
  ObjectIterator it;
  uint8_t *local_78;
  uint8_t *local_70;
  uint8_t *local_68;
  string_view local_60;
  ObjectIterator local_50;
  
  _Var1._M_head_impl =
       (this->_builder)._M_t.
       super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
       ._M_t.
       super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
       .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Builder *)0x0) {
    Builder::close(_Var1._M_head_impl,in_ESI);
    _Var1._M_head_impl =
         (this->_builder)._M_t.
         super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
         ._M_t.
         super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
         .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl;
    if ((_Var1._M_head_impl)->_pos == 0) {
      slice = "";
    }
    else {
      slice = Builder::start(_Var1._M_head_impl);
    }
    ObjectIterator::ObjectIterator(&local_50,(Slice)slice,true);
    if (local_50._position != local_50._size) {
      do {
        local_70 = (uint8_t *)ObjectIterator::key(&local_50,false);
        local_60 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                             ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *
                              )&local_70);
        local_78 = (uint8_t *)ObjectIterator::value(&local_50);
        std::
        _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_char_const*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_char_const*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>,unsigned_char_const*>
                  ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_char_const*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_char_const*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->_keyToId,&local_60,&local_78);
        local_78 = (uint8_t *)ObjectIterator::value(&local_50);
        uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUInt
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_78);
        local_60._M_len = uVar2;
        local_68 = local_70;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_char_const*>,std::allocator<std::pair<unsigned_long_const,unsigned_char_const*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_long,unsigned_char_const*>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_char_const*>,std::allocator<std::pair<unsigned_long_const,unsigned_char_const*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->_idToKey,&local_60,&local_68);
        ObjectIterator::next(&local_50);
      } while (local_50._position != local_50._size);
    }
  }
  return;
}

Assistant:

void AttributeTranslator::seal() {
  if (_builder == nullptr) {
    return;
  }

  _builder->close();

  Slice s(_builder->slice());

  ObjectIterator it(s, /*useSequentialIteration*/ true);

  while (it.valid()) {
    Slice key(it.key(false));
    VELOCYPACK_ASSERT(key.isString());

    // insert into string and char lookup maps
    _keyToId.emplace(key.stringView(), it.value().begin());
    // insert into id to slice lookup map
    _idToKey.emplace(it.value().getUInt(), key.begin());
    it.next();
  }
}